

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

string * __thiscall Color::bg_abi_cxx11_(string *__return_storage_ptr__,Color *this)

{
  string *psVar1;
  string *psVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  string *psVar6;
  stringstream s;
  ostream local_188 [376];
  
  uVar3 = this->_value;
  if ((uVar3 >> 0x15 & 1) == 0) {
    lVar5 = 10;
    psVar6 = (string *)&__TMC_END__;
    do {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) goto LAB_0010c5a1;
      psVar1 = psVar6 + 0x30;
      psVar2 = psVar6 + 0x50;
      psVar6 = psVar1;
    } while (*(uint *)psVar2 != (uVar3 >> 8 & 0xff));
    std::__cxx11::string::string((string *)__return_storage_ptr__,psVar1);
  }
  else if ((uVar3 >> 0x14 & 1) == 0) {
LAB_0010c5a1:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&s);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&s);
    poVar4 = std::operator<<(local_188,"color");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Color::bg () const
{
#ifdef FEATURE_COLOR
  int index = (_value & _COLOR_BG) >> 8;

  if (_value & _COLOR_256)
  {
    if (_value & _COLOR_HASBG)
    {
      std::stringstream s;
      s << "color" << ((_value & _COLOR_BG) >> 8);
      return s.str ();
    }
  }
  else
  {
    for (unsigned int i = 0; i < NUM_COLORS; ++i)
      if (allColors[i].index == index)
        return allColors[i].english_name;
  }
#endif

  return "";
}